

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall
Corrade::Utility::String::Implementation::anon_unknown_12::uppercaseInPlaceImplementation::
anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this,char *data,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  code *pcVar7;
  ostream *poVar8;
  ulong in_RDX;
  undefined8 *in_RSI;
  __m256i chars_2;
  __m256i chars_1;
  char *i;
  __m256i chars;
  anon_class_24_3_3f66add7 uppercaseOneVectorInPlace;
  __m256i lowercaseBit;
  __m256i lowest25;
  __m256i aAndAbove;
  char *end;
  Flags local_409;
  Error local_408;
  undefined8 local_3e0;
  undefined8 uStackY_3d8;
  undefined8 uStackY_3d0;
  undefined8 uStackY_3c8;
  undefined8 local_3c0;
  undefined8 uStackY_3b8;
  undefined8 uStackY_3b0;
  undefined8 uStackY_3a8;
  Flags local_371;
  Error local_370;
  undefined8 *local_348;
  undefined8 local_340;
  undefined8 uStackY_338;
  undefined8 uStackY_330;
  undefined8 uStackY_328;
  undefined8 local_320;
  undefined8 uStackY_318;
  undefined8 uStackY_310;
  undefined8 uStackY_308;
  __m256i *chars_00;
  anon_class_24_3_3f66add7 *this_00;
  anon_class_24_3_3f66add7 local_2c0;
  undefined8 uStack_2a8;
  longlong local_2a0;
  longlong lStack_298;
  longlong lStack_290;
  longlong lStack_288;
  undefined8 *local_260;
  ulong local_258;
  undefined8 *local_250;
  undefined8 *local_240;
  undefined8 *local_230;
  undefined1 local_223;
  undefined1 local_222;
  undefined1 local_221;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 *local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 *local_108;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined1 local_e0;
  undefined1 local_df;
  undefined1 local_de;
  undefined1 local_dd;
  undefined1 local_dc;
  undefined1 local_db;
  undefined1 local_da;
  undefined1 local_d9;
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80 [32];
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  local_260 = (undefined8 *)((long)in_RSI + in_RDX);
  local_250 = in_RSI;
  if (in_RDX < 0x20) {
    local_258 = in_RDX;
    pcVar7 = (code *)uppercaseInPlaceImplementation();
    (*pcVar7)(local_250,local_258);
  }
  else {
    local_221 = 0x9f;
    local_c1 = 0x9f;
    local_c2 = 0x9f;
    local_c3 = 0x9f;
    local_c4 = 0x9f;
    local_c5 = 0x9f;
    local_c6 = 0x9f;
    local_c7 = 0x9f;
    local_c8 = 0x9f;
    local_c9 = 0x9f;
    local_ca = 0x9f;
    local_cb = 0x9f;
    local_cc = 0x9f;
    local_cd = 0x9f;
    local_ce = 0x9f;
    local_cf = 0x9f;
    local_d0 = 0x9f;
    local_d1 = 0x9f;
    local_d2 = 0x9f;
    local_d3 = 0x9f;
    local_d4 = 0x9f;
    local_d5 = 0x9f;
    local_d6 = 0x9f;
    local_d7 = 0x9f;
    local_d8 = 0x9f;
    local_d9 = 0x9f;
    local_da = 0x9f;
    local_db = 0x9f;
    local_dc = 0x9f;
    local_dd = 0x9f;
    local_de = 0x9f;
    local_df = 0x9f;
    local_e0 = 0x9f;
    auVar1 = vpinsrb_avx(ZEXT116(0x9f),0x9f,1);
    auVar1 = vpinsrb_avx(auVar1,0x9f,2);
    auVar1 = vpinsrb_avx(auVar1,0x9f,3);
    auVar1 = vpinsrb_avx(auVar1,0x9f,4);
    auVar1 = vpinsrb_avx(auVar1,0x9f,5);
    auVar1 = vpinsrb_avx(auVar1,0x9f,6);
    auVar1 = vpinsrb_avx(auVar1,0x9f,7);
    auVar1 = vpinsrb_avx(auVar1,0x9f,8);
    auVar1 = vpinsrb_avx(auVar1,0x9f,9);
    auVar1 = vpinsrb_avx(auVar1,0x9f,10);
    auVar1 = vpinsrb_avx(auVar1,0x9f,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x9f,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x9f,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x9f,0xe);
    local_100 = vpinsrb_avx(auVar1,0x9f,0xf);
    auVar1 = vpinsrb_avx(ZEXT116(0x9f),0x9f,1);
    auVar1 = vpinsrb_avx(auVar1,0x9f,2);
    auVar1 = vpinsrb_avx(auVar1,0x9f,3);
    auVar1 = vpinsrb_avx(auVar1,0x9f,4);
    auVar1 = vpinsrb_avx(auVar1,0x9f,5);
    auVar1 = vpinsrb_avx(auVar1,0x9f,6);
    auVar1 = vpinsrb_avx(auVar1,0x9f,7);
    auVar1 = vpinsrb_avx(auVar1,0x9f,8);
    auVar1 = vpinsrb_avx(auVar1,0x9f,9);
    auVar1 = vpinsrb_avx(auVar1,0x9f,10);
    auVar1 = vpinsrb_avx(auVar1,0x9f,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x9f,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x9f,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x9f,0xe);
    auStack_f0 = vpinsrb_avx(auVar1,0x9f,0xf);
    local_2a0 = local_100._0_8_;
    lStack_298 = local_100._8_8_;
    lStack_290 = auStack_f0._0_8_;
    lStack_288 = auStack_f0._8_8_;
    local_222 = 0x19;
    local_81 = 0x19;
    local_82 = 0x19;
    local_83 = 0x19;
    local_84 = 0x19;
    local_85 = 0x19;
    local_86 = 0x19;
    local_87 = 0x19;
    local_88 = 0x19;
    local_89 = 0x19;
    local_8a = 0x19;
    local_8b = 0x19;
    local_8c = 0x19;
    local_8d = 0x19;
    local_8e = 0x19;
    local_8f = 0x19;
    local_90 = 0x19;
    local_91 = 0x19;
    local_92 = 0x19;
    local_93 = 0x19;
    local_94 = 0x19;
    local_95 = 0x19;
    local_96 = 0x19;
    local_97 = 0x19;
    local_98 = 0x19;
    local_99 = 0x19;
    local_9a = 0x19;
    local_9b = 0x19;
    local_9c = 0x19;
    local_9d = 0x19;
    local_9e = 0x19;
    local_9f = 0x19;
    local_a0 = 0x19;
    auVar1 = vpinsrb_avx(ZEXT116(0x19),0x19,1);
    auVar1 = vpinsrb_avx(auVar1,0x19,2);
    auVar1 = vpinsrb_avx(auVar1,0x19,3);
    auVar1 = vpinsrb_avx(auVar1,0x19,4);
    auVar1 = vpinsrb_avx(auVar1,0x19,5);
    auVar1 = vpinsrb_avx(auVar1,0x19,6);
    auVar1 = vpinsrb_avx(auVar1,0x19,7);
    auVar1 = vpinsrb_avx(auVar1,0x19,8);
    auVar1 = vpinsrb_avx(auVar1,0x19,9);
    auVar1 = vpinsrb_avx(auVar1,0x19,10);
    auVar1 = vpinsrb_avx(auVar1,0x19,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x19,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x19,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x19,0xe);
    local_c0 = vpinsrb_avx(auVar1,0x19,0xf);
    auVar1 = vpinsrb_avx(ZEXT116(0x19),0x19,1);
    auVar1 = vpinsrb_avx(auVar1,0x19,2);
    auVar1 = vpinsrb_avx(auVar1,0x19,3);
    auVar1 = vpinsrb_avx(auVar1,0x19,4);
    auVar1 = vpinsrb_avx(auVar1,0x19,5);
    auVar1 = vpinsrb_avx(auVar1,0x19,6);
    auVar1 = vpinsrb_avx(auVar1,0x19,7);
    auVar1 = vpinsrb_avx(auVar1,0x19,8);
    auVar1 = vpinsrb_avx(auVar1,0x19,9);
    auVar1 = vpinsrb_avx(auVar1,0x19,10);
    auVar1 = vpinsrb_avx(auVar1,0x19,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x19,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x19,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x19,0xe);
    auStack_b0 = vpinsrb_avx(auVar1,0x19,0xf);
    local_2c0.aAndAbove = (__m256i *)local_c0._0_8_;
    local_2c0.lowest25 = (__m256i *)local_c0._8_8_;
    local_2c0.lowercaseBit = (__m256i *)auStack_b0._0_8_;
    uStack_2a8 = auStack_b0._8_8_;
    local_223 = 0x20;
    local_31 = 0x20;
    local_32 = 0x20;
    local_33 = 0x20;
    local_34 = 0x20;
    local_35 = 0x20;
    local_36 = 0x20;
    local_37 = 0x20;
    local_38 = 0x20;
    local_39 = 0x20;
    local_3a = 0x20;
    local_3b = 0x20;
    local_3c = 0x20;
    local_3d = 0x20;
    local_3e = 0x20;
    local_3f = 0x20;
    local_40 = 0x20;
    local_41 = 0x20;
    local_42 = 0x20;
    local_43 = 0x20;
    local_44 = 0x20;
    local_45 = 0x20;
    local_46 = 0x20;
    local_47 = 0x20;
    local_48 = 0x20;
    local_49 = 0x20;
    local_4a = 0x20;
    local_4b = 0x20;
    local_4c = 0x20;
    local_4d = 0x20;
    local_4e = 0x20;
    local_4f = 0x20;
    local_50 = 0x20;
    auVar1 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
    auVar1 = vpinsrb_avx(auVar1,0x20,2);
    auVar1 = vpinsrb_avx(auVar1,0x20,3);
    auVar1 = vpinsrb_avx(auVar1,0x20,4);
    auVar1 = vpinsrb_avx(auVar1,0x20,5);
    auVar1 = vpinsrb_avx(auVar1,0x20,6);
    auVar1 = vpinsrb_avx(auVar1,0x20,7);
    auVar1 = vpinsrb_avx(auVar1,0x20,8);
    auVar1 = vpinsrb_avx(auVar1,0x20,9);
    auVar1 = vpinsrb_avx(auVar1,0x20,10);
    auVar1 = vpinsrb_avx(auVar1,0x20,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x20,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x20,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x20,0xe);
    auVar1 = vpinsrb_avx(auVar1,0x20,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
    auVar2 = vpinsrb_avx(auVar2,0x20,2);
    auVar2 = vpinsrb_avx(auVar2,0x20,3);
    auVar2 = vpinsrb_avx(auVar2,0x20,4);
    auVar2 = vpinsrb_avx(auVar2,0x20,5);
    auVar2 = vpinsrb_avx(auVar2,0x20,6);
    auVar2 = vpinsrb_avx(auVar2,0x20,7);
    auVar2 = vpinsrb_avx(auVar2,0x20,8);
    auVar2 = vpinsrb_avx(auVar2,0x20,9);
    auVar2 = vpinsrb_avx(auVar2,0x20,10);
    auVar2 = vpinsrb_avx(auVar2,0x20,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x20,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x20,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x20,0xe);
    auVar2 = vpinsrb_avx(auVar2,0x20,0xf);
    local_80._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    local_80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    chars_00 = (__m256i *)&local_2a0;
    this_00 = &local_2c0;
    local_320 = *in_RSI;
    uStackY_318 = in_RSI[1];
    uStackY_310 = in_RSI[2];
    uStackY_308 = in_RSI[3];
    operator()::anon_class_24_3_3f66add7::operator()(this_00,chars_00);
    local_340 = local_320;
    uStackY_338 = uStackY_318;
    uStackY_330 = uStackY_310;
    uStackY_328 = uStackY_308;
    local_1c0 = local_320;
    uStack_1b8 = uStackY_318;
    uStack_1b0 = uStackY_310;
    uStack_1a8 = uStackY_308;
    local_168 = local_250;
    local_1a0 = local_320;
    uStack_198 = uStackY_318;
    uStack_190 = uStackY_310;
    uStack_188 = uStackY_308;
    *local_250 = local_320;
    local_250[1] = uStackY_318;
    local_250[2] = uStackY_310;
    local_250[3] = uStackY_308;
    local_348 = (undefined8 *)((ulong)(local_250 + 4) & 0xffffffffffffffe0);
    if (local_348 < local_250) {
      poVar8 = Error::defaultOutput();
      Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_371)
      ;
      Error::Error(&local_370,poVar8,local_371);
      Debug::operator<<(&local_370.super_Debug,
                        "Assertion i >= data && reinterpret_cast<std::uintptr_t>(i) % 32 == 0 failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/String.cpp:814"
                       );
      Error::~Error(&local_370);
      abort();
    }
    for (; local_348 + 4 <= local_260; local_348 = local_348 + 4) {
      local_230 = local_348;
      local_3c0 = *local_348;
      uStackY_3b8 = local_348[1];
      uStackY_3b0 = local_348[2];
      uStackY_3a8 = local_348[3];
      operator()::anon_class_24_3_3f66add7::operator()(this_00,chars_00);
      local_108 = local_348;
      local_3e0 = local_3c0;
      uStackY_3d8 = uStackY_3b8;
      uStackY_3d0 = uStackY_3b0;
      uStackY_3c8 = uStackY_3a8;
      local_160 = local_3c0;
      uStack_158 = uStackY_3b8;
      uStack_150 = uStackY_3b0;
      uStack_148 = uStackY_3a8;
      local_140 = local_3c0;
      uStack_138 = uStackY_3b8;
      uStack_130 = uStackY_3b0;
      uStack_128 = uStackY_3a8;
      *local_348 = local_3c0;
      local_348[1] = uStackY_3b8;
      local_348[2] = uStackY_3b0;
      local_348[3] = uStackY_3a8;
    }
    if (local_348 < local_260) {
      if (local_348 + 4 <= local_260) {
        poVar8 = Error::defaultOutput();
        Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                  (&local_409);
        Error::Error(&local_408,poVar8,local_409);
        Debug::operator<<(&local_408.super_Debug,
                          "Assertion i + 32 > end failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/String.cpp:826"
                         );
        Error::~Error(&local_408);
        abort();
      }
      local_348 = local_260 + -4;
      uVar3 = *local_348;
      uVar4 = local_260[-3];
      uVar5 = local_260[-2];
      uVar6 = local_260[-1];
      local_240 = local_348;
      operator()::anon_class_24_3_3f66add7::operator()(this_00,chars_00);
      *local_348 = uVar3;
      local_348[1] = uVar4;
      local_348[2] = uVar5;
      local_348[3] = uVar6;
    }
  }
  return;
}

Assistant:

CORRADE_UTILITY_CPU_MAYBE_UNUSED CORRADE_ENABLE_AVX2 typename std::decay<decltype(lowercaseInPlace)>::type uppercaseInPlaceImplementation(Cpu::Avx2T) {
  return [](char* const data, const std::size_t size) CORRADE_ENABLE_AVX2 {
    char* const end = data + size;

    /* If we have less than 32 bytes, fall back to the SSE variant */
    /** @todo deinline it here? any speed gains from rewriting using 128-bit
        AVX? or does the compiler do that automatically? */
    if(size < 32)
        return uppercaseInPlaceImplementation(Cpu::Sse2)(data, size);

    /* Core algorithm */
    const __m256i aAndAbove = _mm256_set1_epi8(char(256u - std::uint8_t('a')));
    const __m256i lowest25 = _mm256_set1_epi8(25);
    const __m256i lowercaseBit = _mm256_set1_epi8(0x20);
    /* See the comment next to lowercaseOneVectorInPlace() above for why this
       is done in-place */
    const auto uppercaseOneVectorInPlace = [&](__m256i& chars) CORRADE_ENABLE_AVX2 {
        /* Moves 'a' and everything above to 0 and up (it overflows and wraps
           around) */
        const __m256i lowercaseInLowest25 = _mm256_add_epi8(chars, aAndAbove);
        /* Subtracts 25 with saturation, which makes the original 'a' to 'z'
           (now 0 to 25) zero and everything else non-zero */
        const __m256i lowest25IsZero = _mm256_subs_epu8(lowercaseInLowest25, lowest25);
        /* Mask indicating where uppercase letters where, i.e. which values are
           now zero */
        const __m256i maskUppercase = _mm256_cmpeq_epi8(lowest25IsZero, _mm256_setzero_si256());
        /* For the masked chars a lowercase bit is set, and the bit is then
           subtracted from the original chars, making the lowercase chars
           uppercase */
        chars = _mm256_sub_epi8(chars, _mm256_and_si256(maskUppercase, lowercaseBit));
    };

    /* Unconditionally convert the first vector in a slower, unaligned way. Any
       extra branching to avoid the unaligned load & store if already aligned
       would be most probably more expensive than the actual operation. */
    {
        __m256i chars = _mm256_loadu_si256(reinterpret_cast<const __m256i*>(data));
        uppercaseOneVectorInPlace(chars);
        _mm256_storeu_si256(reinterpret_cast<__m256i*>(data), chars);
    }

    /* Go to the next aligned position. If the pointer was already aligned,
       we'll go to the next aligned vector; if not, there will be an overlap
       and we'll convert some bytes twice. Which is fine, uppercasing
       already-uppercased data is a no-op. */
    char* i = reinterpret_cast<char*>(reinterpret_cast<std::uintptr_t>(data + 32) & ~0x1f);
    CORRADE_INTERNAL_DEBUG_ASSERT(i >= data && reinterpret_cast<std::uintptr_t>(i) % 32 == 0);

    /* Convert all aligned vectors using aligned load/store */
    for(; i + 32 <= end; i += 32) {
        __m256i chars = _mm256_load_si256(reinterpret_cast<const __m256i*>(i));
        uppercaseOneVectorInPlace(chars);
        _mm256_store_si256(reinterpret_cast<__m256i*>(i), chars);
    }

    /* Handle remaining less than a vector with an unaligned load & store,
       again overlapping back with the previous already-converted elements */
    if(i < end) {
        CORRADE_INTERNAL_DEBUG_ASSERT(i + 32 > end);
        i = end - 32;
        __m256i chars = _mm256_loadu_si256(reinterpret_cast<const __m256i*>(i));
        uppercaseOneVectorInPlace(chars);
        _mm256_storeu_si256(reinterpret_cast<__m256i*>(i), chars);
    }
  };
}